

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::BlockSizes_WriteRaw_Test::BlockSizes_WriteRaw_Test
          (BlockSizes_WriteRaw_Test *this)

{
  BlockSizes_WriteRaw_Test *this_local;
  
  BlockSizes::BlockSizes(&this->super_BlockSizes);
  (this->super_BlockSizes).super_CodedStreamTest.super_Test._vptr_Test =
       (_func_int **)&PTR__BlockSizes_WriteRaw_Test_02a16570;
  (this->super_BlockSizes).super_WithParamInterface<int>._vptr_WithParamInterface =
       (_func_int **)&DAT_02a165b0;
  return;
}

Assistant:

TEST_P(BlockSizes, WriteRaw) {
  int kBlockSizes_case = GetParam();
  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    coded_output.WriteRaw(kRawBytes, sizeof(kRawBytes));
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(sizeof(kRawBytes), coded_output.ByteCount());
  }

  EXPECT_EQ(sizeof(kRawBytes), output.ByteCount());
  EXPECT_EQ(0, memcmp(buffer_, kRawBytes, sizeof(kRawBytes)));
}